

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Normalize(NormalizeForm4 Normalize)

{
  byte bVar1;
  uint uVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  reference pvVar4;
  pair<unsigned_int,_unsigned_int> value;
  reference pvVar5;
  byte *pbVar6;
  const_reference pvVar7;
  reference pvVar8;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffe08;
  uint32_t in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe14;
  uint8_t in_stack_fffffffffffffe16;
  uint8_t in_stack_fffffffffffffe17;
  uint32_t in_stack_fffffffffffffe18;
  uint32_t in_stack_fffffffffffffe1c;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe20;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *pvVar9;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined2 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe32;
  undefined1 in_stack_fffffffffffffe33;
  value_type vVar10;
  undefined4 in_stack_fffffffffffffe34;
  uint32_t *in_stack_fffffffffffffe50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe58;
  size_type __n;
  uint32_t in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe64;
  value_type vVar11;
  uint32_t in_stack_fffffffffffffe68;
  value_type vVar12;
  uint32_t in_stack_fffffffffffffe6c;
  value_type vVar13;
  Image *in_stack_fffffffffffffe70;
  undefined1 isAnyValue;
  undefined1 *puVar14;
  Image *in_stack_fffffffffffffea8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  pair<unsigned_int,_unsigned_int> local_134;
  pair<unsigned_int,_unsigned_int> local_12c;
  undefined1 local_121;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_120;
  int local_108;
  int local_104;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8 [2];
  undefined1 local_a8 [96];
  undefined1 local_48 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffe0c);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe17,in_stack_fffffffffffffe16);
  Test_Helper::uniformImage
            (in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             (Image *)CONCAT17(in_stack_fffffffffffffe17,
                               CONCAT16(in_stack_fffffffffffffe16,
                                        CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10
                                                ))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1ddf55);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe17,in_stack_fffffffffffffe16);
  Test_Helper::uniformImage
            (in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             (Image *)CONCAT17(in_stack_fffffffffffffe17,
                               CONCAT16(in_stack_fffffffffffffe16,
                                        CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10
                                                ))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1ddf99);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1ddfa6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1ddfb3);
  puVar14 = &local_121;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1ddfc8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_fffffffffffffe34,
                       CONCAT13(in_stack_fffffffffffffe33,
                                CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30))),
           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
           (allocator_type *)in_stack_fffffffffffffe20);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1ddff1);
  pVar3 = Unit_Test::imageSize
                    ((Image *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_12c = pVar3;
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_120,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,&local_12c);
  value = Unit_Test::imageSize
                    ((Image *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pvVar9 = &local_120;
  local_134 = value;
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](pvVar9,1);
  isAnyValue = (undefined1)((ulong)pvVar9 >> 0x38);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,&local_134);
  Unit_Test::generateRoi
            ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)in_stack_fffffffffffffe70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (uint32_t *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_e8,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_100,0);
  Unit_Test::fillImage
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_e8,0);
  vVar11 = *pvVar5;
  this = &local_100;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,0);
  vVar12 = *pvVar5;
  __n = 1;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_e8,1);
  vVar13 = *pvVar5;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,__n);
  (*local_8)(local_48,vVar11,vVar12,local_a8,vVar13,*pvVar5,local_104,local_108);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1de1dd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe34,
                      CONCAT13(in_stack_fffffffffffffe33,
                               CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30))),
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (allocator_type *)in_stack_fffffffffffffe20);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1de203);
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  uVar2 = (uint)*pbVar6;
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  if ((uVar2 == *pbVar6) || ((local_104 == 1 && (local_108 == 1)))) {
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
    vVar10 = *pvVar7;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_150,1);
    *pvVar8 = vVar10;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_150,0);
    *pvVar8 = vVar10;
  }
  else {
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_150,0);
    *pvVar8 = '\0';
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_150,1);
    *pvVar8 = 0xff;
  }
  pvVar9 = (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_e8,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_100,(size_type)pvVar9)
  ;
  bVar1 = Unit_Test::verifyImage
                    (in_stack_fffffffffffffea8,(uint32_t)((ulong)puVar14 >> 0x20),(uint32_t)puVar14,
                     pVar3.second,pVar3.first,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)value,(bool)isAnyValue
                    );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar9);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(pvVar9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar9);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1de457);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1de464);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar9);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form4_Normalize(NormalizeForm4 Normalize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input  = uniformImage();
        PenguinV_Image::Image output = uniformImage();

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;

        std::vector < std::pair < uint32_t, uint32_t > > size( 2 );

        size[0] = imageSize( input );
        size[1] = imageSize( output );

        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        fillImage( input, roiX[0], roiY[0], roiWidth, roiHeight, intensity );

        Normalize( input, roiX[0], roiY[0], output, roiX[1], roiY[1], roiWidth, roiHeight );

        std::vector < uint8_t > normalized( 2 );

        if( intensity[0] == intensity[1] || (roiWidth == 1 && roiHeight == 1) ) {
            normalized[0] = normalized[1] = intensity[0];
        }
        else {
            normalized[0] = 0;
            normalized[1] = 255;
        }

        return verifyImage( output, roiX[1], roiY[1], roiWidth, roiHeight, normalized );
    }